

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O3

bool cellClipTest(QTextTable *table,QTextTableData *td,PaintContext *cell_context,
                 QTextTableCell *cell,QRectF cellRect)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  byte bVar4;
  long in_FS_OFFSET;
  EdgeData local_b8;
  EdgeData local_98;
  EdgeData local_78;
  EdgeData local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = 0;
  if ((0.0 < (cell_context->clip).w) && (bVar4 = 0, 0.0 < (cell_context->clip).h)) {
    if (td->borderCollapse == true) {
      axisEdgeData(&local_58,table,td,cell,LeftEdge);
      axisEdgeData(&local_78,table,td,cell,TopEdge);
      axisEdgeData(&local_98,table,td,cell,RightEdge);
      axisEdgeData(&local_b8,table,td,cell,BottomEdge);
      cellRect.xp = cellRect.xp + local_58.width * -0.5;
      dVar3 = cellRect.yp + local_78.width * -0.5;
      auVar1._8_4_ = SUB84(dVar3,0);
      auVar1._0_8_ = cellRect.xp;
      auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
      cellRect.yp = auVar1._8_8_;
      cellRect.w = (local_98.width * 0.5 - local_58.width * -0.5) + cellRect.w;
      cellRect.h = (local_b8.width * 0.5 - local_78.width * -0.5) + cellRect.h;
    }
    else {
      dVar3 = (double)(td->super_QTextFrameData).border.val * 0.015625;
      cellRect.xp = cellRect.xp - dVar3;
      cellRect.yp = cellRect.yp - dVar3;
      cellRect.w = dVar3 + dVar3 + cellRect.w;
      dVar3 = dVar3 + dVar3 + cellRect.h;
      auVar2._8_4_ = SUB84(dVar3,0);
      auVar2._0_8_ = cellRect.w;
      auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
      cellRect.h = auVar2._8_8_;
    }
    bVar4 = QRectF::intersects(&cellRect);
    bVar4 = bVar4 ^ 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)bVar4;
  }
  __stack_chk_fail();
}

Assistant:

static bool cellClipTest(QTextTable *table, QTextTableData *td,
                         const QAbstractTextDocumentLayout::PaintContext &cell_context,
                         const QTextTableCell &cell,
                         QRectF cellRect)
{
#ifdef QT_NO_CSSPARSER
    Q_UNUSED(table);
    Q_UNUSED(cell);
#endif

    if (!cell_context.clip.isValid())
        return false;

    if (td->borderCollapse) {
        // we need to account for the cell borders in the clipping test
#ifndef QT_NO_CSSPARSER
        cellRect.adjust(-axisEdgeData(table, td, cell, QCss::LeftEdge).width / 2,
                        -axisEdgeData(table, td, cell, QCss::TopEdge).width / 2,
                        axisEdgeData(table, td, cell, QCss::RightEdge).width / 2,
                        axisEdgeData(table, td, cell, QCss::BottomEdge).width / 2);
#endif
    } else {
        qreal border = td->border.toReal();
        cellRect.adjust(-border, -border, border, border);
    }

    if (!cellRect.intersects(cell_context.clip))
        return true;

    return false;
}